

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O3

bool __thiscall cmDocumentation::PrintRequestedDocumentation(cmDocumentation *this,ostream *os)

{
  int iVar1;
  bool bVar2;
  ostream *this_00;
  ostream *os_00;
  pointer pRVar3;
  bool bVar4;
  
  pRVar3 = (this->RequestedHelpItems).
           super__Vector_base<cmDocumentation::RequestedHelpItem,_std::allocator<cmDocumentation::RequestedHelpItem>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pRVar3 == (this->RequestedHelpItems).
                super__Vector_base<cmDocumentation::RequestedHelpItem,_std::allocator<cmDocumentation::RequestedHelpItem>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    bVar4 = true;
  }
  else {
    bVar4 = true;
    iVar1 = 0;
    do {
      std::__cxx11::string::_M_assign((string *)&this->CurrentArgument);
      if ((pRVar3->Filename)._M_string_length == 0) {
        if (0 < iVar1) {
          std::__ostream_insert<char,std::char_traits<char>>(os,"\n\n",2);
        }
        this_00 = (ostream *)0x0;
        os_00 = os;
        iVar1 = iVar1 + 1;
      }
      else {
        this_00 = (ostream *)operator_new(0x200);
        std::ofstream::ofstream(this_00,(pRVar3->Filename)._M_dataplus._M_p,_S_out);
        os_00 = this_00;
      }
      bVar2 = PrintDocumentation(this,pRVar3->HelpType,os_00);
      if ((!bVar2) || (((&os_00->field_0x20)[(long)os_00->_vptr_basic_ostream[-3]] & 5) != 0)) {
        bVar4 = false;
      }
      if (this_00 != (ostream *)0x0) {
        (*this_00->_vptr_basic_ostream[1])(this_00);
      }
      pRVar3 = pRVar3 + 1;
    } while (pRVar3 != (this->RequestedHelpItems).
                       super__Vector_base<cmDocumentation::RequestedHelpItem,_std::allocator<cmDocumentation::RequestedHelpItem>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  return bVar4;
}

Assistant:

bool cmDocumentation::PrintRequestedDocumentation(std::ostream& os)
{
  int count = 0;
  bool result = true;

  // Loop over requested documentation types.
  for(std::vector<RequestedHelpItem>::const_iterator
      i = this->RequestedHelpItems.begin();
      i != this->RequestedHelpItems.end();
      ++i)
    {
    this->CurrentArgument = i->Argument;
    // If a file name was given, use it.  Otherwise, default to the
    // given stream.
    cmsys::ofstream* fout = 0;
    std::ostream* s = &os;
    if(!i->Filename.empty())
      {
      fout = new cmsys::ofstream(i->Filename.c_str(), std::ios::out);
      if(fout)
        {
        s = fout;
        }
      else
        {
        result = false;
        }
      }
    else if(++count > 1)
      {
      os << "\n\n";
      }

    // Print this documentation type to the stream.
    if(!this->PrintDocumentation(i->HelpType, *s) || !*s)
      {
      result = false;
      }

    // Close the file if we wrote one.
    if(fout)
      {
      delete fout;
      }
    }
  return result;
}